

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O3

SmartPointer<GEO::Counted> * __thiscall
GEO::SmartPointer<GEO::Counted>::operator=(SmartPointer<GEO::Counted> *this,Counted *ptr)

{
  int *piVar1;
  Counted *pCVar2;
  
  pCVar2 = this->pointer_;
  if (pCVar2 != ptr) {
    if (pCVar2 != (Counted *)0x0) {
      piVar1 = &pCVar2->nb_refs_;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*pCVar2->_vptr_Counted[1])();
      }
    }
    this->pointer_ = ptr;
    if (ptr != (Counted *)0x0) {
      ptr->nb_refs_ = ptr->nb_refs_ + 1;
    }
  }
  return this;
}

Assistant:

SmartPointer<T>& operator= (T* ptr) {
            if(ptr != pointer_) {
                T::unref(pointer_);
                pointer_ = ptr;
                T::ref(pointer_);
            }
            return *this;
        }